

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O1

void linearize_assignment(Proc *proc,AstNodeList *expr_list,node_info *varinfo,int nv)

{
  uint line_number;
  ravitype_t rVar1;
  uint line_number_00;
  uint *puVar2;
  C_MemoryAllocator *pCVar3;
  void *pvVar4;
  _func_void_ptr_void_ptr_size_t_size_t *p_Var5;
  BasicBlock *pBVar6;
  VariableType *pVVar7;
  VariableType *pVVar8;
  Pseudo *val_pseudo;
  long lVar9;
  int iVar10;
  long lVar11;
  AstNode *expr;
  Pseudo *pPVar12;
  Pseudo *pPVar13;
  char *ptr;
  undefined1 *ptr_00;
  ulong uVar14;
  undefined8 *puVar15;
  long lVar16;
  ravitype_t type;
  char cVar17;
  long lVar18;
  Pseudo **ppPVar19;
  int iVar20;
  ulong uVar21;
  undefined8 auStack_c8 [3];
  undefined1 local_b0 [8];
  PtrListIterator expriter__;
  Pseudo *local_68;
  
  auStack_c8[1] = 0x11bf4e;
  iVar10 = raviX_ptrlist_size((PtrList *)expr_list);
  lVar11 = (long)iVar10;
  lVar18 = lVar11 * -0x10;
  lVar9 = lVar18 + -0xb8;
  auStack_c8[lVar11 * -2 + 1] = 0x11bf7b;
  raviX_ptrlist_forward_iterator((PtrListIterator *)local_b0,(PtrList *)expr_list);
  auStack_c8[lVar11 * -2 + 1] = 0x11bf83;
  expr = (AstNode *)raviX_ptrlist_iter_next((PtrListIterator *)local_b0);
  if (expr == (AstNode *)0x0) {
    line_number = 0;
    local_68 = (Pseudo *)0x0;
  }
  else {
    puVar15 = (undefined8 *)(local_b0 + lVar18);
    line_number = 0;
    iVar20 = 1;
    do {
      if (line_number == 0) {
        line_number = expr->line_number;
      }
      auStack_c8[lVar11 * -2 + 1] = 0x11bfbf;
      local_68 = linearize_expression(proc,expr);
      pPVar12 = local_68;
      if (((undefined1  [48])*local_68 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
        auStack_c8[lVar11 * -2 + 1] = 0x11bfdd;
        pPVar12 = indexed_load(proc,local_68);
      }
      puVar15[-1] = &expr->field_2;
      pPVar13 = pPVar12;
      if ((undefined1  [48])((undefined1  [48])*pPVar12 & (undefined1  [48])0xf) ==
          (undefined1  [48])0x0) {
        type = RAVI_TANY;
        if ((((pPVar12->field_3).symbol)->symbol_type < SYM_GLOBAL) &&
           (rVar1 = (((pPVar12->field_3).symbol)->field_1).variable.value_type.type_code,
           type = -(uint)(rVar1 != RAVI_TNUMFLT) | RAVI_TNUMFLT, rVar1 == RAVI_TNUMINT)) {
          type = RAVI_TNUMINT;
        }
        line_number_00 = expr->line_number;
        auStack_c8[lVar11 * -2 + 1] = 0x11c02e;
        pPVar13 = allocate_temp_pseudo(proc,type,true);
        auStack_c8[lVar11 * -2 + 1] = 0x11c048;
        instruct_move(proc,op_mov,pPVar13,pPVar12,line_number_00);
      }
      *puVar15 = pPVar13;
      if ((iVar20 < iVar10) && ((*(uint *)pPVar12 & 0xf) == 0xb)) {
        if ((pPVar12->field_3).range_in_use != 0) {
          auStack_c8[lVar11 * -2 + 1] = 0x11c443;
          __assert_fail("pseudo->range_in_use == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                        ,0x24a,"Pseudo *convert_range_to_temp(Pseudo *)");
        }
        *(uint *)pPVar12 = *(uint *)pPVar12 & 0xfffffff0 | 4;
      }
      auStack_c8[lVar11 * -2 + 1] = 0x11c07e;
      expr = (AstNode *)raviX_ptrlist_iter_next((PtrListIterator *)local_b0);
      puVar15 = puVar15 + 2;
      iVar20 = iVar20 + 1;
    } while (expr != (AstNode *)0x0);
  }
  uVar14 = (ulong)(uint)nv;
  if (0 < nv) {
    expriter__._16_8_ = ZEXT48(iVar10 - 1);
    lVar16 = 8;
    uVar21 = 0;
    do {
      if ((long)uVar21 < lVar11) {
        pPVar12 = *(Pseudo **)(local_b0 + lVar16 + lVar9 + 0xb0);
        if (((undefined1  [48])*pPVar12 & (undefined1  [48])0xf) == (undefined1  [48])0xb) {
          if (expriter__._16_8_ != uVar21) {
            auStack_c8[lVar11 * -2 + 1] = 0x11c462;
            __assert_fail("i == note_ne-1",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                          ,0x738,
                          "void linearize_assignment(Proc *, AstNodeList *, struct node_info *, int)"
                         );
          }
          auStack_c8[lVar11 * -2 + 1] = 0x11c126;
          pPVar13 = raviX_allocate_range_select_pseudo(proc,pPVar12,0);
          *(Pseudo **)(local_b0 + lVar16 + lVar9 + 0xb0) = pPVar13;
        }
        else {
          pPVar12 = (Pseudo *)0x0;
        }
        pVVar7 = *(VariableType **)((long)varinfo + lVar16 + -8);
        pPVar13 = *(Pseudo **)((long)&varinfo->vartype + lVar16);
        pVVar8 = *(VariableType **)((long)auStack_c8 + lVar16 + lVar18 + 8);
        val_pseudo = *(Pseudo **)(local_b0 + lVar16 + lVar9 + 0xb0);
        auStack_c8[lVar11 * -2 + 1] = 0x11c29b;
        linearize_store_var(proc,pVVar7,pPVar13,pVVar8,val_pseudo,line_number);
        auStack_c8[lVar11 * -2 + 1] = 0x11c2a8;
        free_temp_pseudo(proc,val_pseudo,false);
        if (pPVar12 != (Pseudo *)0x0) {
          auStack_c8[lVar11 * -2 + 1] = 0x11c2c2;
          free_temp_pseudo(proc,pPVar12,false);
        }
      }
      else if ((local_68 == (Pseudo *)0x0) ||
              (((undefined1  [48])*local_68 & (undefined1  [48])0xf) != (undefined1  [48])0xb)) {
        iVar20 = **(int **)((long)varinfo + lVar16 + -8);
        if ((iVar20 == 0x20) || ((iVar20 == 0x80 || (iVar20 == 0x40)))) {
          puVar2 = *(uint **)((long)&varinfo->vartype + lVar16);
          cVar17 = (iVar20 == 0x40) * '\x02' + ';';
          pCVar3 = proc->linearizer->compiler_state->allocator;
          pvVar4 = pCVar3->arena;
          p_Var5 = pCVar3->calloc;
          auStack_c8[lVar11 * -2 + 1] = 0x11c1e8;
          ptr = (char *)(*p_Var5)(pvVar4,1,0x28);
          if (iVar20 == 0x20) {
            cVar17 = '<';
          }
          *ptr = cVar17;
          *(uint *)(ptr + 0x20) = line_number;
          if ((*puVar2 & 0xf) == 0xe) goto LAB_0011c405;
          pCVar3 = proc->linearizer->compiler_state->allocator;
          auStack_c8[lVar11 * -2 + 1] = 0x11c233;
          raviX_ptrlist_add((PtrList **)(ptr + 0x10),puVar2,pCVar3);
          if ((*(BasicBlock **)(ptr + 0x18) != (BasicBlock *)0x0) &&
             (*(BasicBlock **)(ptr + 0x18) != proc->current_bb)) goto LAB_0011c462;
          pBVar6 = proc->current_bb;
          pCVar3 = proc->linearizer->compiler_state->allocator;
          auStack_c8[lVar11 * -2 + 1] = 0x11c265;
          raviX_ptrlist_add((PtrList **)&pBVar6->insns,ptr,pCVar3);
          *(BasicBlock **)(ptr + 0x18) = proc->current_bb;
        }
        else {
          puVar2 = *(uint **)((long)&varinfo->vartype + lVar16);
          pCVar3 = proc->linearizer->compiler_state->allocator;
          pvVar4 = pCVar3->arena;
          p_Var5 = pCVar3->calloc;
          auStack_c8[lVar11 * -2 + 1] = 0x11c2ed;
          ptr_00 = (undefined1 *)(*p_Var5)(pvVar4,1,0x28);
          *ptr_00 = 0x5d;
          *(uint *)(ptr_00 + 0x20) = line_number;
          if ((*puVar2 & 0xf) == 0xe) {
LAB_0011c405:
            auStack_c8[lVar11 * -2 + 1] = 0x11c424;
            __assert_fail("pseudo->type != PSEUDO_INDEXED",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                          ,0x193,"void add_instruction_target(Proc *, Instruction *, Pseudo *)");
          }
          pCVar3 = proc->linearizer->compiler_state->allocator;
          auStack_c8[lVar11 * -2 + 1] = 0x11c325;
          raviX_ptrlist_add((PtrList **)(ptr_00 + 0x10),puVar2,pCVar3);
          if ((*(BasicBlock **)(ptr_00 + 0x18) != (BasicBlock *)0x0) &&
             (*(BasicBlock **)(ptr_00 + 0x18) != proc->current_bb)) {
LAB_0011c462:
            auStack_c8[lVar11 * -2 + 1] = linearize_store_var;
            __assert_fail("insn->block == NULL || insn->block == proc->current_bb",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                          ,0x1b1,"void add_instruction(Proc *, Instruction *)");
          }
          pBVar6 = proc->current_bb;
          pCVar3 = proc->linearizer->compiler_state->allocator;
          auStack_c8[lVar11 * -2 + 1] = 0x11c356;
          raviX_ptrlist_add((PtrList **)&pBVar6->insns,ptr_00,pCVar3);
          *(BasicBlock **)(ptr_00 + 0x18) = proc->current_bb;
        }
      }
      else {
        auStack_c8[lVar11 * -2 + 1] = 0x11c152;
        pPVar13 = raviX_allocate_range_select_pseudo(proc,local_68,(1 - iVar10) + (int)uVar21);
        pVVar7 = *(VariableType **)((long)varinfo + lVar16 + -8);
        pPVar12 = *(Pseudo **)((long)&varinfo->vartype + lVar16);
        pVVar8 = (VariableType *)auStack_c8[0];
        auStack_c8[lVar11 * -2 + 1] = 0x11c17c;
        linearize_store_var(proc,pVVar7,pPVar12,pVVar8,pPVar13,line_number);
        auStack_c8[lVar11 * -2 + 1] = 0x11c189;
        free_temp_pseudo(proc,pPVar13,false);
      }
      uVar21 = uVar21 + 1;
      lVar16 = lVar16 + 0x10;
    } while (uVar14 != uVar21);
  }
  if (0 < iVar10) {
    lVar18 = lVar11 + 1;
    puVar15 = auStack_c8 + 1;
    do {
      pPVar12 = (Pseudo *)*puVar15;
      auStack_c8[lVar11 * -2 + 1] = 0x11c397;
      free_temp_pseudo(proc,pPVar12,false);
      lVar18 = lVar18 + -1;
      puVar15 = puVar15 + -2;
    } while (1 < lVar18);
  }
  if (0 < nv) {
    lVar18 = uVar14 + 1;
    ppPVar19 = &varinfo[uVar14 - 1].pseudo;
    do {
      pPVar12 = *ppPVar19;
      auStack_c8[lVar11 * -2 + 1] = 0x11c3cc;
      free_temp_pseudo(proc,pPVar12,false);
      lVar18 = lVar18 + -1;
      ppPVar19 = ppPVar19 + -2;
    } while (1 < lVar18);
  }
  if ((local_68 != (Pseudo *)0x0) &&
     (((undefined1  [48])*local_68 & (undefined1  [48])0xf) == (undefined1  [48])0xb)) {
    auStack_c8[lVar11 * -2 + 1] = 0x11c3f6;
    free_temp_pseudo(proc,local_68,false);
  }
  return;
}

Assistant:

static void linearize_assignment(Proc *proc, AstNodeList *expr_list, struct node_info *varinfo, int nv)
{
	AstNode *expr;

	// Process RHS expressions
	int ne = raviX_ptrlist_size((const PtrList *)expr_list);
	struct node_info *valinfo = (struct node_info *)alloca(ne * sizeof(struct node_info));
	Pseudo *last_val_pseudo = NULL;
	int i = 0;
	unsigned line_number = 0;
	FOR_EACH_PTR(expr_list, AstNode, expr)
	{
		line_number = line_number == 0 ? expr->line_number : line_number;
		Pseudo *val_pseudo = last_val_pseudo = linearize_expression(proc, expr);
		if (val_pseudo->type == PSEUDO_INDEXED)
			val_pseudo = indexed_load(proc, val_pseudo);
		valinfo[i].vartype = &expr->common_expr.type;
		// To support the Lua semantics of x,y = y,x as a swap
		// we need to copy locals to temps
		// TODO can this be optimized to only do when needed
		// See also check_conflict() in Lua parser
		valinfo[i].pseudo = copy_to_temp_if_necessary(proc, val_pseudo, expr->line_number);
		i++;
		if (i < ne && val_pseudo->type == PSEUDO_RANGE) {
			convert_range_to_temp(val_pseudo);
		}
	}
	END_FOR_EACH_PTR(expr)

	/* TODO do we need to insert type assertions in some cases such as function return values ? */

	int note_ne = ne;
	// nv = number of variables (LHS)
	// ne = number of expressions (RHS)
	for (i = 0; i < nv; i++) {
		if (i >= ne) {
			// Went past ne
			if (last_val_pseudo != NULL && last_val_pseudo->type == PSEUDO_RANGE) {
				int pick = i - ne + 1;
				Pseudo *range_select_pseudo = raviX_allocate_range_select_pseudo(proc, last_val_pseudo, pick);
				linearize_store_var(proc, varinfo[i].vartype, varinfo[i].pseudo,
						    valinfo[ne-1].vartype,
				    range_select_pseudo, line_number);
				free_temp_pseudo(proc, range_select_pseudo, false);
			} else {
				if (varinfo[i].vartype->type_code == RAVI_TTABLE ||
				    varinfo[i].vartype->type_code == RAVI_TARRAYFLT ||
				    varinfo[i].vartype->type_code == RAVI_TARRAYINT) {
					linearize_table_constructor_inplace(proc, varinfo[i].pseudo, varinfo[i].vartype->type_code, line_number);
				}
				else {
					linearize_init(proc, varinfo[i].pseudo, line_number);
				}
			}
		}
		else {
			Pseudo *range_pseudo = NULL;
			if (valinfo[i].pseudo->type == PSEUDO_RANGE) {
				/* Only the topmost expression can be a range ... assert */
				assert(i == note_ne-1);
				range_pseudo = valinfo[i].pseudo;
				valinfo[i].pseudo = raviX_allocate_range_select_pseudo(proc, valinfo[i].pseudo, 0);
			}
			linearize_store_var(proc, varinfo[i].vartype, varinfo[i].pseudo,
					    valinfo[i].vartype, valinfo[i].pseudo, line_number);
			free_temp_pseudo(proc, valinfo[i].pseudo, false);
			if (range_pseudo) {
				free_temp_pseudo(proc, range_pseudo, false);
			}
		}
	}

	for (int i = ne-1; i >= 0; i--) {
		free_temp_pseudo(proc, valinfo[i].pseudo, false);
	}
	for (int i = nv-1; i >= 0; i--) {
		free_temp_pseudo(proc, varinfo[i].pseudo, false);
	}
	if (last_val_pseudo != NULL && last_val_pseudo->type == PSEUDO_RANGE) {
		free_temp_pseudo(proc, last_val_pseudo, false);
	}
	return;
}